

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

double __thiscall
TxConfirmStats::EstimateMedianVal
          (TxConfirmStats *this,int confTarget,double sufficientTxVal,double successBreakPoint,
          uint nBlockHeight,EstimationResult *result)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  Logger *this_00;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long in_FS_OFFSET;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  string_view source_file;
  string_view logging_function;
  uint local_fc;
  double local_c0;
  float failed_within_target_perc;
  float passed_within_target_perc;
  double median;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double adStack_50 [2];
  int confTarget_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = this->buckets;
  uVar10 = this->scale;
  pvVar2 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar5 = 0;
  uVar15 = (int)((ulong)((long)(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 3) - 1;
  local_78 = -1.0;
  dStack_70 = -1.0;
  dVar25 = 0.0;
  dVar27 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_58 = 0.0;
  adStack_50[0] = 0.0;
  local_a8 = -1.0;
  dStack_a0 = -1.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  dVar22 = 0.0;
  uVar16 = uVar15;
  local_fc = uVar15;
  if ((int)uVar15 < 0) {
    bVar7 = true;
    dVar20 = 0.0;
    dVar23 = 0.0;
    uVar10 = uVar15;
  }
  else {
    lVar9 = (long)(int)(((confTarget + uVar10) - 1) / uVar10);
    pvVar3 = (this->confAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (int)((ulong)((long)(this->confAvg).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3) *
             uVar10 * -0x55555555;
    bVar7 = true;
    dVar20 = 0.0;
    iVar11 = 0;
    dVar23 = 0.0;
    bVar5 = 0;
    bVar6 = true;
    uVar14 = (ulong)uVar15;
    do {
      uVar13 = (uint)uVar14;
      if (bVar7) {
        bVar7 = false;
        uVar16 = uVar13;
      }
      dVar28 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      dVar21 = dVar20 + *(double *)
                         (*(long *)&(this->failAvg).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar9 + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         uVar14 * 8);
      uVar12 = nBlockHeight - confTarget;
      iVar17 = uVar10 - confTarget;
      if ((uint)confTarget < uVar10) {
        do {
          iVar11 = iVar11 + *(int *)(*(long *)&pvVar2[(ulong)uVar12 %
                                                      (ulong)(uint)((int)((ulong)((long)(this->
                                                  unconfTxs).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pvVar2) >> 3) * -0x55555555)].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data + uVar14 * 4);
          uVar12 = uVar12 - 1;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      dVar23 = dVar23 + dVar28;
      dVar26 = dVar25 + *(double *)
                         (*(long *)&pvVar3[lVar9 + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         uVar14 * 8);
      dVar28 = dVar27 + dVar28;
      iVar11 = iVar11 + (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14];
      dVar20 = dVar21;
      dVar25 = dVar26;
      dVar27 = dVar28;
      if (sufficientTxVal / (1.0 - this->decay) <= dVar23) {
        dVar24 = (double)iVar11;
        if (successBreakPoint <= dVar26 / (dVar28 + dVar21 + dVar24)) {
          local_88 = 0.0;
          dStack_80 = 0.0;
          local_98 = 0.0;
          dStack_90 = 0.0;
          local_a8 = -1.0;
          dStack_a0 = -1.0;
          dVar25 = 0.0;
          dVar27 = 0.0;
          iVar11 = 0;
          dVar23 = 0.0;
          bVar6 = true;
          bVar7 = true;
          bVar5 = 1;
          dVar20 = 0.0;
          uVar15 = uVar13;
          local_fc = uVar16;
          local_68 = dVar26;
          dStack_60 = dVar28;
          local_58 = dVar24;
          adStack_50[0] = dVar21;
        }
        else {
          dVar23 = 0.0;
          if (bVar6) {
            uVar8 = uVar13;
            uVar12 = uVar16;
            if (uVar13 < uVar16) {
              uVar8 = uVar16;
              uVar12 = uVar13;
            }
            local_a8 = 0.0;
            if (uVar12 != 0) {
              local_a8 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar12 - 1];
            }
            dStack_a0 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
            bVar6 = false;
            local_98 = dVar26;
            dStack_90 = dVar28;
            local_88 = dVar24;
            dStack_80 = dVar21;
          }
        }
      }
      bVar4 = 0 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar4);
    dVar23 = (double)iVar11;
    bVar7 = (bool)(bVar6 ^ 1U | bVar7);
    uVar10 = 0;
  }
  median = -1.0;
  uVar13 = uVar15;
  if (uVar15 < local_fc) {
    uVar13 = local_fc;
    local_fc = uVar15;
  }
  uVar15 = local_fc;
  do {
    dVar22 = dVar22 + (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar15];
    uVar15 = uVar15 + 1;
  } while (uVar15 <= uVar13);
  if ((bool)(bVar5 & dVar22 != 0.0)) {
    dVar22 = dVar22 * 0.5;
    uVar15 = local_fc;
    do {
      dVar28 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15];
      if (dVar22 <= dVar28) {
        median = (this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15] / dVar28;
        break;
      }
      dVar22 = dVar22 - dVar28;
      uVar15 = uVar15 + 1;
    } while (uVar15 <= uVar13);
    if (local_fc == 0) {
      uVar18 = 0;
      uVar19 = 0;
    }
    else {
      dVar22 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[local_fc - 1];
      uVar18 = SUB84(dVar22,0);
      uVar19 = (undefined4)((ulong)dVar22 >> 0x20);
    }
    local_78 = (double)CONCAT44(uVar19,uVar18);
    dStack_70 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar13];
  }
  if (!bVar7) {
    uVar15 = uVar10;
    if (uVar10 < uVar16) {
      uVar15 = uVar16;
      uVar16 = uVar10;
    }
    if (uVar16 == 0) {
      uVar18 = 0;
      uVar19 = 0;
    }
    else {
      dVar22 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar16 - 1];
      uVar18 = SUB84(dVar22,0);
      uVar19 = (undefined4)((ulong)dVar22 >> 0x20);
    }
    local_a8 = (double)CONCAT44(uVar19,uVar18);
    dStack_a0 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar15];
    local_98 = dVar25;
    dStack_90 = dVar27;
    local_88 = dVar23;
    dStack_80 = dVar20;
  }
  passed_within_target_perc = 0.0;
  dVar22 = dStack_60 + local_58 + adStack_50[0];
  failed_within_target_perc = 0.0;
  if ((dVar22 != 0.0) || (NAN(dVar22))) {
    passed_within_target_perc = (float)((local_68 * 100.0) / dVar22);
  }
  dVar22 = dStack_90 + local_88 + dStack_80;
  if ((dVar22 != 0.0) || (NAN(dVar22))) {
    failed_within_target_perc = (float)((local_98 * 100.0) / dVar22);
  }
  confTarget_local = confTarget;
  this_00 = LogInstance();
  bVar7 = BCLog::Logger::WillLogCategoryLevel(this_00,ESTIMATEFEE,Debug);
  if (bVar7) {
    local_c0 = successBreakPoint * 100.0;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "EstimateMedianVal";
    logging_function._M_len = 0x11;
    LogPrintFormatInternal<int,double,double,double,double,double,float,double,double,double,double,double,double,float,double,double,double,double>
              (logging_function,source_file,0x18b,ESTIMATEFEE,Debug,
               (ConstevalFormatString<18U>)0xfb97b3,&confTarget_local,&local_c0,&this->decay,&median
               ,&local_78,&dStack_70,&passed_within_target_perc,&local_68,&dStack_60,&local_58,
               adStack_50,&local_a8,&dStack_a0,&failed_within_target_perc,&local_98,&dStack_90,
               &local_88,&dStack_80);
  }
  if (result != (EstimationResult *)0x0) {
    (result->pass).inMempool = local_58;
    (result->pass).leftMempool = adStack_50[0];
    (result->pass).withinTarget = local_68;
    (result->pass).totalConfirmed = dStack_60;
    (result->pass).start = local_78;
    (result->pass).end = dStack_70;
    (result->fail).start = local_a8;
    (result->fail).end = dStack_a0;
    (result->fail).withinTarget = local_98;
    (result->fail).totalConfirmed = dStack_90;
    (result->fail).inMempool = local_88;
    (result->fail).leftMempool = dStack_80;
    result->decay = this->decay;
    result->scale = this->scale;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return median;
  }
  __stack_chk_fail();
}

Assistant:

double TxConfirmStats::EstimateMedianVal(int confTarget, double sufficientTxVal,
                                         double successBreakPoint, unsigned int nBlockHeight,
                                         EstimationResult *result) const
{
    // Counters for a bucket (or range of buckets)
    double nConf = 0; // Number of tx's confirmed within the confTarget
    double totalNum = 0; // Total number of tx's that were ever confirmed
    int extraNum = 0;  // Number of tx's still in mempool for confTarget or longer
    double failNum = 0; // Number of tx's that were never confirmed but removed from the mempool after confTarget
    const int periodTarget = (confTarget + scale - 1) / scale;
    const int maxbucketindex = buckets.size() - 1;

    // We'll combine buckets until we have enough samples.
    // The near and far variables will define the range we've combined
    // The best variables are the last range we saw which still had a high
    // enough confirmation rate to count as success.
    // The cur variables are the current range we're counting.
    unsigned int curNearBucket = maxbucketindex;
    unsigned int bestNearBucket = maxbucketindex;
    unsigned int curFarBucket = maxbucketindex;
    unsigned int bestFarBucket = maxbucketindex;

    // We'll always group buckets into sets that meet sufficientTxVal --
    // this ensures that we're using consistent groups between different
    // confirmation targets.
    double partialNum = 0;

    bool foundAnswer = false;
    unsigned int bins = unconfTxs.size();
    bool newBucketRange = true;
    bool passing = true;
    EstimatorBucket passBucket;
    EstimatorBucket failBucket;

    // Start counting from highest feerate transactions
    for (int bucket = maxbucketindex; bucket >= 0; --bucket) {
        if (newBucketRange) {
            curNearBucket = bucket;
            newBucketRange = false;
        }
        curFarBucket = bucket;
        nConf += confAvg[periodTarget - 1][bucket];
        partialNum += txCtAvg[bucket];
        totalNum += txCtAvg[bucket];
        failNum += failAvg[periodTarget - 1][bucket];
        for (unsigned int confct = confTarget; confct < GetMaxConfirms(); confct++)
            extraNum += unconfTxs[(nBlockHeight - confct) % bins][bucket];
        extraNum += oldUnconfTxs[bucket];
        // If we have enough transaction data points in this range of buckets,
        // we can test for success
        // (Only count the confirmed data points, so that each confirmation count
        // will be looking at the same amount of data and same bucket breaks)

        if (partialNum < sufficientTxVal / (1 - decay)) {
            // the buckets we've added in this round aren't sufficient
            // so keep adding
            continue;
        } else {
            partialNum = 0; // reset for the next range we'll add

            double curPct = nConf / (totalNum + failNum + extraNum);

            // Check to see if we are no longer getting confirmed at the success rate
            if (curPct < successBreakPoint) {
                if (passing == true) {
                    // First time we hit a failure record the failed bucket
                    unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
                    unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
                    failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
                    failBucket.end = buckets[failMaxBucket];
                    failBucket.withinTarget = nConf;
                    failBucket.totalConfirmed = totalNum;
                    failBucket.inMempool = extraNum;
                    failBucket.leftMempool = failNum;
                    passing = false;
                }
                continue;
            }
            // Otherwise update the cumulative stats, and the bucket variables
            // and reset the counters
            else {
                failBucket = EstimatorBucket(); // Reset any failed bucket, currently passing
                foundAnswer = true;
                passing = true;
                passBucket.withinTarget = nConf;
                nConf = 0;
                passBucket.totalConfirmed = totalNum;
                totalNum = 0;
                passBucket.inMempool = extraNum;
                passBucket.leftMempool = failNum;
                failNum = 0;
                extraNum = 0;
                bestNearBucket = curNearBucket;
                bestFarBucket = curFarBucket;
                newBucketRange = true;
            }
        }
    }

    double median = -1;
    double txSum = 0;

    // Calculate the "average" feerate of the best bucket range that met success conditions
    // Find the bucket with the median transaction and then report the average feerate from that bucket
    // This is a compromise between finding the median which we can't since we don't save all tx's
    // and reporting the average which is less accurate
    unsigned int minBucket = std::min(bestNearBucket, bestFarBucket);
    unsigned int maxBucket = std::max(bestNearBucket, bestFarBucket);
    for (unsigned int j = minBucket; j <= maxBucket; j++) {
        txSum += txCtAvg[j];
    }
    if (foundAnswer && txSum != 0) {
        txSum = txSum / 2;
        for (unsigned int j = minBucket; j <= maxBucket; j++) {
            if (txCtAvg[j] < txSum)
                txSum -= txCtAvg[j];
            else { // we're in the right bucket
                median = m_feerate_avg[j] / txCtAvg[j];
                break;
            }
        }

        passBucket.start = minBucket ? buckets[minBucket-1] : 0;
        passBucket.end = buckets[maxBucket];
    }

    // If we were passing until we reached last few buckets with insufficient data, then report those as failed
    if (passing && !newBucketRange) {
        unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
        unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
        failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
        failBucket.end = buckets[failMaxBucket];
        failBucket.withinTarget = nConf;
        failBucket.totalConfirmed = totalNum;
        failBucket.inMempool = extraNum;
        failBucket.leftMempool = failNum;
    }

    float passed_within_target_perc = 0.0;
    float failed_within_target_perc = 0.0;
    if ((passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool)) {
        passed_within_target_perc = 100 * passBucket.withinTarget / (passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool);
    }
    if ((failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool)) {
        failed_within_target_perc = 100 * failBucket.withinTarget / (failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool);
    }

    LogDebug(BCLog::ESTIMATEFEE, "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n",
             confTarget, 100.0 * successBreakPoint, decay,
             median, passBucket.start, passBucket.end,
             passed_within_target_perc,
             passBucket.withinTarget, passBucket.totalConfirmed, passBucket.inMempool, passBucket.leftMempool,
             failBucket.start, failBucket.end,
             failed_within_target_perc,
             failBucket.withinTarget, failBucket.totalConfirmed, failBucket.inMempool, failBucket.leftMempool);


    if (result) {
        result->pass = passBucket;
        result->fail = failBucket;
        result->decay = decay;
        result->scale = scale;
    }
    return median;
}